

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

int Gia_Gen2CreateMux_rec(Gia_Man_t *pNew,int *pCtrl,int nCtrl,Vec_Int_t *vData,int Shift)

{
  int iData0;
  int iVar1;
  
  if (nCtrl != 0) {
    iVar1 = nCtrl + -1;
    iData0 = Gia_Gen2CreateMux_rec(pNew,pCtrl,iVar1,vData,Shift);
    iVar1 = Gia_Gen2CreateMux_rec(pNew,pCtrl,iVar1,vData,(1 << ((byte)iVar1 & 0x1f)) + Shift);
    iVar1 = Gia_ManHashMux(pNew,pCtrl[(long)nCtrl + -1],iVar1,iData0);
    return iVar1;
  }
  if ((-1 < Shift) && (Shift < vData->nSize)) {
    return vData->pArray[(uint)Shift];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_Gen2CreateMux_rec( Gia_Man_t * pNew, int * pCtrl, int nCtrl, Vec_Int_t * vData, int Shift )
{
    int iLit0, iLit1;
    if ( nCtrl == 0 )
        return Vec_IntEntry( vData, Shift );
    iLit0 = Gia_Gen2CreateMux_rec( pNew, pCtrl, nCtrl-1, vData, Shift );
    iLit1 = Gia_Gen2CreateMux_rec( pNew, pCtrl, nCtrl-1, vData, Shift + (1<<(nCtrl-1)) );
    return Gia_ManHashMux( pNew, pCtrl[nCtrl-1], iLit1, iLit0 );
}